

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O3

int Gia_ManConeMark_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRoots,int nLimit)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar5 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar5) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar5] == p->nTravIds) {
    return 0;
  }
  p->pTravIds[iVar5] = p->nTravIds;
  uVar3 = *(ulong *)pObj;
  uVar4 = (uint)uVar3;
  uVar6 = uVar3 & 0x1fffffff;
  if (uVar6 == 0x1fffffff || (int)uVar4 < 0) {
    if (-1 < (int)uVar4 || (int)uVar6 == 0x1fffffff) {
      if ((~uVar4 & 0x9fffffff) != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                      ,0xf3,"int Gia_ManConeMark_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
      }
      uVar4 = (uint)(uVar3 >> 0x20) & 0x1fffffff;
      iVar5 = p->vCis->nSize;
      if (iVar5 - p->nRegs <= (int)uVar4) {
        iVar1 = p->vCos->nSize;
        uVar4 = (iVar1 - iVar5) + uVar4;
        if (((int)uVar4 < 0) || (iVar1 <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = p->vCos->pArray[uVar4];
        if ((iVar5 < 0) || (p->nObjs <= iVar5)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        Vec_IntPush(vRoots,iVar5);
      }
      goto LAB_00667853;
    }
    iVar5 = Gia_ManConeMark_rec(p,pObj + -uVar6,vRoots,nLimit);
  }
  else {
    iVar5 = Gia_ManConeMark_rec(p,pObj + -uVar6,vRoots,nLimit);
    if (iVar5 != 0) {
      return 1;
    }
    iVar5 = Gia_ManConeMark_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vRoots,
                                nLimit);
  }
  if (iVar5 != 0) {
    return 1;
  }
LAB_00667853:
  return (uint)(nLimit < vRoots->nSize);
}

Assistant:

int Gia_ManConeMark_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRoots, int nLimit )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin0(pObj), vRoots, nLimit ) )
            return 1;
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin1(pObj), vRoots, nLimit ) )
            return 1;
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin0(pObj), vRoots, nLimit ) )
            return 1;
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( Gia_ObjIsPi(p, pObj) )
    {}
    else assert( 0 );
    return (int)(Vec_IntSize(vRoots) > nLimit);
}